

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptor::InternalDependenciesOnceInit(FileDescriptor *this)

{
  DescriptorPool *this_00;
  int iVar1;
  int iVar2;
  LogMessage *pLVar3;
  size_t sVar4;
  FileDescriptor *pFVar5;
  string_view local_68;
  once_flag *local_58;
  char *name;
  once_flag *poStack_48;
  int i;
  char *names_ptr;
  byte local_29;
  LogMessage local_28;
  Voidify local_11;
  FileDescriptor *local_10;
  FileDescriptor *this_local;
  
  local_29 = 0;
  local_10 = this;
  if ((this->finished_building_ & 1U) != 1) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
               ,0x28ce,"finished_building_ == true");
    local_29 = 1;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar3);
  }
  if ((local_29 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_28);
  }
  poStack_48 = this->dependencies_once_ + 1;
  for (name._4_4_ = 0; iVar1 = name._4_4_, iVar2 = dependency_count(this), iVar1 < iVar2;
      name._4_4_ = name._4_4_ + 1) {
    local_58 = poStack_48;
    sVar4 = strlen((char *)poStack_48);
    poStack_48 = (once_flag *)
                 ((long)&(poStack_48->control_).super___atomic_base<unsigned_int>._M_i + sVar4 + 1);
    if ((char)(local_58->control_).super___atomic_base<unsigned_int>._M_i != '\0') {
      this_00 = this->pool_;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_68,(char *)local_58);
      pFVar5 = DescriptorPool::FindFileByName(this_00,local_68);
      this->dependencies_[name._4_4_] = pFVar5;
    }
  }
  return;
}

Assistant:

void FileDescriptor::InternalDependenciesOnceInit() const {
  ABSL_CHECK(finished_building_ == true);
  const char* names_ptr = reinterpret_cast<const char*>(dependencies_once_ + 1);
  for (int i = 0; i < dependency_count(); i++) {
    const char* name = names_ptr;
    names_ptr += strlen(name) + 1;
    if (name[0] != '\0') {
      dependencies_[i] = pool_->FindFileByName(name);
    }
  }
}